

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.h
# Opt level: O2

string * __thiscall
google::protobuf::compiler::js::GeneratorOptions::GetFileNameExtension_abi_cxx11_
          (string *__return_storage_ptr__,GeneratorOptions *this)

{
  allocator local_11;
  
  if (this->import_style == kImportClosure) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->extension);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"_pb.js",&local_11);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetFileNameExtension() const {
    return import_style == kImportClosure ? extension : "_pb.js";
  }